

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O1

bool __thiscall CEditor::PopupColorPicker(CEditor *this,void *pContext,CUIRect View)

{
  CUI *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  float *pfVar5;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float q;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  CQuadItem QuadItemMarker;
  float Y;
  float X;
  CUIRect Palette;
  CUIRect HuePicker;
  CUIRect SVPicker;
  float local_13c;
  undefined8 local_128;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  CUIRect local_e8;
  CUIRect local_d8;
  CUIRect local_c8;
  CUIRect local_b8;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  undefined4 local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 local_70;
  float fStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined8 local_5c;
  float fStack_54;
  undefined8 uStack_50;
  undefined8 local_48;
  float fStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = View;
  CUIRect::HSplitBottom(&local_b8,20.0,&local_c8,&local_e8);
  CUIRect::VSplitRight(&local_c8,20.0,&local_c8,&local_d8);
  CUIRect::VSplitLeft(&local_d8,4.0,(CUIRect *)0x0,&local_d8);
  CUIRect::HSplitTop(&local_e8,4.0,(CUIRect *)0x0,&local_e8);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])(this->m_pGraphics,0xffffffff);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_128._0_4_ = *(float *)&(this->m_SelectedPickerColor).field_0;
  local_128._4_4_ = (this->m_SelectedPickerColor).field_1;
  fVar7 = (float)local_128 * 6.0;
  fVar10 = 1.0 - (fVar7 - (float)(int)fVar7);
  fVar8 = (fVar7 - (float)(int)fVar7) * -0.0 + 1.0;
  fVar6 = fVar10 * -0.0 + 1.0;
  iVar3 = (int)fVar7 % 6;
  fStack_68 = 0.0;
  fStack_84 = 0.0;
  fStack_80 = 0.0;
  fStack_7c = 0.0;
  switch(iVar3) {
  case 0:
    fStack_84 = 1.0;
    fStack_80 = fVar6;
    break;
  case 1:
    fStack_84 = fVar8;
    fStack_80 = 1.0;
    break;
  case 2:
    fStack_84 = 1.0;
    fStack_80 = 1.0;
    fStack_7c = fVar6;
    goto switchD_001acf09_default;
  case 3:
    fStack_84 = 1.0;
    fStack_80 = fVar8;
    break;
  case 4:
    fStack_84 = fVar6;
    fStack_80 = 1.0;
    break;
  case 5:
    fStack_84 = 1.0;
    fStack_80 = 1.0;
    fStack_7c = fVar8;
  default:
    goto switchD_001acf09_default;
  }
  fStack_7c = 1.0;
switchD_001acf09_default:
  local_13c = (this->m_SelectedPickerColor).field_2.z;
  local_88 = 0;
  fVar9 = 1.0 - fVar10;
  fVar7 = 0.0;
  fVar11 = 0.0;
  switch(iVar3) {
  case 0:
    fVar7 = 1.0;
    fVar11 = fVar9;
    break;
  case 1:
    fVar7 = fVar10;
    fVar11 = 1.0;
    break;
  case 2:
    fStack_68 = fVar9;
    fVar7 = 0.0;
    fVar11 = 1.0;
    break;
  case 3:
    fVar7 = 0.0;
    fVar11 = fVar10;
    goto LAB_001acfc8;
  case 4:
    fVar7 = fVar9;
    fVar11 = 0.0;
LAB_001acfc8:
    fStack_68 = 1.0;
    break;
  case 5:
    fStack_68 = fVar10;
    fVar7 = 1.0;
    fVar11 = 0.0;
  }
  local_78 = 0x13f800000;
  local_70 = CONCAT44(fVar11,fVar7);
  uStack_64 = 0x3f800000;
  fVar11 = 0.0;
  fVar12 = 0.0;
  fStack_54 = 0.0;
  fVar7 = 0.0;
  fVar13 = 0.0;
  switch(iVar3) {
  case 0:
    fVar7 = 1.0;
    fVar13 = fVar9;
    break;
  case 1:
    fVar7 = fVar10;
    fVar13 = 1.0;
    break;
  case 2:
    fStack_54 = fVar9;
    fVar7 = 0.0;
    fVar13 = 1.0;
    break;
  case 3:
    fVar9 = 0.0;
    goto LAB_001ad06c;
  case 4:
    fVar10 = 0.0;
LAB_001ad06c:
    fStack_54 = 1.0;
    fVar7 = fVar9;
    fVar13 = fVar10;
    break;
  case 5:
    fStack_54 = fVar10;
    fVar7 = 1.0;
    fVar13 = 0.0;
  }
  uStack_60 = 2;
  local_5c = CONCAT44(fVar13,fVar7);
  fStack_40 = 0.0;
  switch(iVar3) {
  case 0:
    fVar11 = 1.0;
    fVar12 = fVar6;
    break;
  case 1:
    fVar11 = fVar8;
    fVar12 = 1.0;
    break;
  case 2:
    fVar11 = 1.0;
    fVar12 = 1.0;
    fStack_40 = fVar6;
    goto switchD_001ad0c4_default;
  case 3:
    fVar11 = 1.0;
    fVar12 = fVar8;
    break;
  case 4:
    fVar11 = fVar6;
    fVar12 = 1.0;
    break;
  case 5:
    fVar11 = 1.0;
    fVar12 = 1.0;
    fStack_40 = fVar8;
  default:
    goto switchD_001ad0c4_default;
  }
  fStack_40 = 1.0;
switchD_001ad0c4_default:
  uStack_50 = 0x33f800000;
  local_48 = CONCAT44(fVar12,fVar11);
  uStack_3c = 0x3f800000;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])(this->m_pGraphics,&local_88,4);
  local_f8 = local_c8.x;
  fStack_f4 = local_c8.y;
  fStack_f0 = local_c8.w;
  fStack_ec = local_c8.h;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_f8,1);
  local_88 = 0;
  fStack_84 = 0.0;
  fStack_80 = 0.0;
  fStack_7c = 0.0;
  local_78 = 0x100000000;
  local_70 = 0;
  fStack_68 = 0.0;
  uStack_64 = 0;
  uStack_60 = 2;
  local_5c = 0;
  fStack_54 = 0.0;
  uStack_50 = 0x33f800000;
  local_48 = 0;
  fStack_40 = 0.0;
  uStack_3c = 0x3f800000;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])(this->m_pGraphics,&local_88,4);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_f8,1);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  fVar6 = (float)local_128._4_4_ * local_c8.w;
  fVar7 = (1.0 - local_13c) * local_c8.h;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])(0x3f000000,0x3f000000,0x3f000000);
  fVar8 = local_c8.x + fVar6;
  fVar10 = local_c8.y + fVar7;
  this_00 = &this->m_UI;
  fVar11 = CUI::PixelSize(this_00);
  fVar9 = CUI::PixelSize(this_00);
  local_9c = CUI::PixelSize(this_00);
  local_9c = local_9c * 11.0;
  local_a8 = fVar8;
  local_a4 = fVar11 * -5.0 + fVar10;
  local_a0 = fVar9;
  fVar8 = CUI::PixelSize(this_00);
  fVar10 = CUI::PixelSize(this_00);
  local_8c = CUI::PixelSize(this_00);
  local_98 = fVar8 * -5.0 + fVar6 + local_c8.x;
  local_94 = fVar7 + local_c8.y;
  local_90 = fVar10 * 11.0;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_a8,2);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  bVar2 = CUI::DoPickerLogic(this_00,&PopupColorPicker::s_SVPicker,&local_c8,&local_fc,&local_100);
  if (bVar2) {
    local_13c = 1.0 - local_100 / local_c8.h;
    local_128 = CONCAT44(local_fc / local_c8.w,(float)local_128);
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  fVar6 = local_d8.h / 6.0;
  pfVar5 = PopupColorPicker::s_aColorIndices[1] + 2;
  lVar4 = 0;
  do {
    fStack_7c = pfVar5[-3];
    lVar1 = lVar4 + 1;
    fStack_54 = *pfVar5;
    local_88 = 0;
    local_70 = *(undefined8 *)(pfVar5 + -5);
    fStack_84 = (float)local_70;
    fStack_80 = (float)((ulong)local_70 >> 0x20);
    local_78 = 0x13f800000;
    uStack_64 = 0x3f800000;
    uStack_60 = 2;
    local_5c = *(undefined8 *)*(float (*) [3])(pfVar5 + -2);
    uStack_50 = 0x33f800000;
    uStack_3c = 0x3f800000;
    fStack_68 = fStack_7c;
    local_48 = local_5c;
    fStack_40 = fStack_54;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])(this->m_pGraphics,&local_88,4);
    local_10c = (float)(int)lVar4 * fVar6 + local_d8.y;
    local_110 = local_d8.x;
    local_108 = local_d8.w;
    local_104 = fVar6;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_110,1);
    pfVar5 = pfVar5 + 3;
    lVar4 = lVar1;
  } while (lVar1 != 6);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])(0x3f000000,0x3f000000,0x3f000000);
  fVar6 = (1.0 - (float)local_128) * local_d8.h;
  local_104 = CUI::PixelSize(this_00);
  local_110 = local_d8.x;
  local_108 = local_d8.w;
  local_10c = fVar6 + local_d8.y;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_110,1);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  bVar2 = CUI::DoPickerLogic(this_00,&PopupColorPicker::s_HuePicker,&local_d8,&local_fc,&local_100);
  if (bVar2) {
    local_128 = CONCAT44(local_128._4_4_,1.0 - local_100 / local_d8.h);
  }
  CUIRect::Draw(&local_e8,&this->m_SelectedColor,0.0,0);
  iVar3 = DoButton_Editor_Common
                    (this,&PopupColorPicker::s_Palette,(char *)0x0,0,&local_e8,0,(char *)0x0);
  if ((iVar3 != 0) && (0.0 < (this->m_SelectedColor).field_3.w)) {
    fVar6 = (this->m_SelectedColor).field_0.x;
    fVar7 = (this->m_SelectedColor).field_1.y;
    fVar8 = (this->m_SelectedColor).field_2.z;
    fVar10 = fVar6;
    if (fVar7 <= fVar6) {
      fVar10 = fVar7;
    }
    if (fVar8 <= fVar10) {
      fVar10 = fVar8;
    }
    local_13c = fVar6;
    if (fVar6 <= fVar7) {
      local_13c = fVar7;
    }
    if (local_13c <= fVar8) {
      local_13c = fVar8;
    }
    fVar11 = 0.0;
    if ((local_13c != fVar10) || (NAN(local_13c) || NAN(fVar10))) {
      fVar11 = local_13c - fVar10;
      if ((local_13c != fVar6) || (NAN(local_13c) || NAN(fVar6))) {
        if ((local_13c != fVar7) || (NAN(local_13c) || NAN(fVar7))) {
          fVar11 = (fVar6 - fVar7) / fVar11 + 4.0;
        }
        else {
          fVar11 = (fVar8 - fVar6) / fVar11 + 2.0;
        }
      }
      else {
        fVar11 = (fVar7 - fVar8) / fVar11;
      }
    }
    fVar11 = fVar11 / 6.0;
    local_128 = CONCAT44(-(uint)(local_13c != 0.0) & (uint)((local_13c - fVar10) / local_13c),
                         ~-(uint)(fVar11 < 0.0) & (uint)fVar11 |
                         (uint)(fVar11 + 1.0) & -(uint)(fVar11 < 0.0));
  }
  (this->m_SelectedPickerColor).field_0 =
       (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)(int)local_128;
  (this->m_SelectedPickerColor).field_1 =
       (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)(int)((ulong)local_128 >> 0x20);
  (this->m_SelectedPickerColor).field_2.z = local_13c;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool CEditor::PopupColorPicker(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect SVPicker, HuePicker, Palette;
	View.HSplitBottom(20.0f, &SVPicker, &Palette);
	SVPicker.VSplitRight(20.0f, &SVPicker, &HuePicker);
	HuePicker.VSplitLeft(4.0f, 0x0, &HuePicker);
	Palette.HSplitTop(4.0f, 0x0, &Palette);

	pEditor->Graphics()->TextureClear();
	pEditor->Graphics()->QuadsBegin();

	// base: white - hue
	vec3 hsv = pEditor->m_SelectedPickerColor;
	IGraphics::CColorVertex ColorArray[4];

	vec3 c = HsvToRgb(vec3(hsv.x, 0.0f, 1.0f));
	ColorArray[0] = IGraphics::CColorVertex(0, c.r, c.g, c.b, 1.0f);
	c = HsvToRgb(vec3(hsv.x, 1.0f, 1.0f));
	ColorArray[1] = IGraphics::CColorVertex(1, c.r, c.g, c.b, 1.0f);
	c = HsvToRgb(vec3(hsv.x, 1.0f, 1.0f));
	ColorArray[2] = IGraphics::CColorVertex(2, c.r, c.g, c.b, 1.0f);
	c = HsvToRgb(vec3(hsv.x, 0.0f, 1.0f));
	ColorArray[3] = IGraphics::CColorVertex(3, c.r, c.g, c.b, 1.0f);

	pEditor->Graphics()->SetColorVertex(ColorArray, 4);

	IGraphics::CQuadItem QuadItem(SVPicker.x, SVPicker.y, SVPicker.w, SVPicker.h);
	pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);

	// base: transparent - black
	ColorArray[0] = IGraphics::CColorVertex(0, 0.0f, 0.0f, 0.0f, 0.0f);
	ColorArray[1] = IGraphics::CColorVertex(1, 0.0f, 0.0f, 0.0f, 0.0f);
	ColorArray[2] = IGraphics::CColorVertex(2, 0.0f, 0.0f, 0.0f, 1.0f);
	ColorArray[3] = IGraphics::CColorVertex(3, 0.0f, 0.0f, 0.0f, 1.0f);

	pEditor->Graphics()->SetColorVertex(ColorArray, 4);

	pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);

	pEditor->Graphics()->QuadsEnd();

	// marker
	vec2 Marker = vec2(hsv.y, (1.0f - hsv.z)) * vec2(SVPicker.w, SVPicker.h);
	pEditor->Graphics()->QuadsBegin();
	pEditor->Graphics()->SetColor(0.5f, 0.5f, 0.5f, 1.0f);
	IGraphics::CQuadItem aMarker[2];
	aMarker[0] = IGraphics::CQuadItem(SVPicker.x+Marker.x, SVPicker.y+Marker.y - 5.0f*pEditor->UI()->PixelSize(), pEditor->UI()->PixelSize(), 11.0f*pEditor->UI()->PixelSize());
	aMarker[1] = IGraphics::CQuadItem(SVPicker.x+Marker.x - 5.0f*pEditor->UI()->PixelSize(), SVPicker.y+Marker.y, 11.0f*pEditor->UI()->PixelSize(), pEditor->UI()->PixelSize());
	pEditor->Graphics()->QuadsDrawTL(aMarker, 2);
	pEditor->Graphics()->QuadsEnd();

	// logic
	float X, Y;
	static int s_SVPicker = 0;
	if(pEditor->UI()->DoPickerLogic(&s_SVPicker, &SVPicker, &X, &Y))
	{
		hsv.y = X/SVPicker.w;
		hsv.z = 1.0f - Y/SVPicker.h;
	}

	// hue slider
	static const float s_aColorIndices[7][3] = {
		{1.0f, 0.0f, 0.0f}, // red
		{1.0f, 0.0f, 1.0f},	// magenta
		{0.0f, 0.0f, 1.0f}, // blue
		{0.0f, 1.0f, 1.0f}, // cyan
		{0.0f, 1.0f, 0.0f}, // green
		{1.0f, 1.0f, 0.0f}, // yellow
		{1.0f, 0.0f, 0.0f}  // red
	};

	pEditor->Graphics()->QuadsBegin();
	vec4 ColorTop, ColorBottom;
	float Offset = HuePicker.h/6.0f;
	for(int j = 0; j < 6; j++)
	{
		ColorTop = vec4(s_aColorIndices[j][0], s_aColorIndices[j][1], s_aColorIndices[j][2], 1.0f);
		ColorBottom = vec4(s_aColorIndices[j+1][0], s_aColorIndices[j+1][1], s_aColorIndices[j+1][2], 1.0f);

		ColorArray[0] = IGraphics::CColorVertex(0, ColorTop.r, ColorTop.g, ColorTop.b, ColorTop.a);
		ColorArray[1] = IGraphics::CColorVertex(1, ColorTop.r, ColorTop.g, ColorTop.b, ColorTop.a);
		ColorArray[2] = IGraphics::CColorVertex(2, ColorBottom.r, ColorBottom.g, ColorBottom.b, ColorBottom.a);
		ColorArray[3] = IGraphics::CColorVertex(3, ColorBottom.r, ColorBottom.g, ColorBottom.b, ColorBottom.a);
		pEditor->Graphics()->SetColorVertex(ColorArray, 4);
		IGraphics::CQuadItem QuadItem(HuePicker.x, HuePicker.y+Offset*j, HuePicker.w, Offset);
		pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);
	}

	// marker
	pEditor->Graphics()->SetColor(0.5f, 0.5f, 0.5f, 1.0f);
	IGraphics::CQuadItem QuadItemMarker(HuePicker.x, HuePicker.y + (1.0f - hsv.x) * HuePicker.h, HuePicker.w, pEditor->UI()->PixelSize());
	pEditor->Graphics()->QuadsDrawTL(&QuadItemMarker, 1);

	pEditor->Graphics()->QuadsEnd();

	static int s_HuePicker = 0;
	if(pEditor->UI()->DoPickerLogic(&s_HuePicker, &HuePicker, &X, &Y))
	{
		hsv.x = 1.0f - Y/HuePicker.h;
	}

	// palette
	static int s_Palette = 0;
	Palette.Draw(pEditor->m_SelectedColor, 0.0f, CUIRect::CORNER_NONE);
	if(pEditor->DoButton_Editor_Common(&s_Palette, 0x0, 0, &Palette, 0, 0x0))
	{
		if(pEditor->m_SelectedColor.a > 0.0f)
			hsv = RgbToHsv(vec3(pEditor->m_SelectedColor.r, pEditor->m_SelectedColor.g, pEditor->m_SelectedColor.b));
	}

	pEditor->m_SelectedPickerColor = hsv;

	return false;
}